

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gwham.hpp
# Opt level: O2

valtype __thiscall
WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
::whamvsrawi(WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
             *this,uint *i,
            gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double> *rho)

{
  ulong *this_00;
  pointer *this_01;
  double dVar1;
  pointer puVar2;
  unsigned_long uVar3;
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double> *pgVar4;
  double extraout_XMM0_Qa;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 local_160 [8];
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double> hist;
  coordtype coord;
  vector<double,_std::allocator<double>_> vals;
  undefined1 local_68 [8];
  pEnsemble Vi;
  double local_38;
  
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>::gnarray
            ((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
              *)local_160,
             (this->hists->
             super__Vector_base<gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_std::allocator<gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start + *i);
  uVar3 = gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>::
          sum((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
               *)local_160);
  auVar6._8_4_ = (int)(uVar3 >> 0x20);
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = 0x45300000;
  dVar1 = (this->expf).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[*i];
  std::__shared_ptr<Ensemble,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Ensemble,_(__gnu_cxx::_Lock_policy)2> *)local_68,
             &(this->V->
              super__Vector_base<std::shared_ptr<Ensemble>,_std::allocator<std::shared_ptr<Ensemble>_>_>
              )._M_impl.super__Vector_impl_data._M_start[*i].
              super___shared_ptr<Ensemble,_(__gnu_cxx::_Lock_policy)2>);
  local_38 = 0.0;
  this_00 = &hist.nelms_tot;
  this_01 = &coord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  for (pgVar4 = (gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
                 *)hist.narr._M_t._M_impl.super__Rb_tree_header._M_header._M_parent; pgVar4 != &hist
      ; pgVar4 = (gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
                  *)std::_Rb_tree_increment((_Rb_tree_node_base *)pgVar4)) {
    puVar2 = (pgVar4->nelms).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    auVar7._0_8_ = (double)CONCAT44(0x43300000,(int)puVar2);
    auVar7._8_4_ = (int)((ulong)puVar2 >> 0x20);
    auVar7._12_4_ = 0x45300000;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &(pgVar4->narr)._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>::
    coord2val((vector<double,_std::allocator<double>_> *)this_01,
              (gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
               *)local_160,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    (***(_func_int ***)local_68)(local_68,this_01);
    Vi.super___shared_ptr<Ensemble,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)exp(-extraout_XMM0_Qa);
    dVar5 = gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>::
            operator[](rho,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    dVar8 = ((auVar7._8_8_ - 1.9342813113834067e+25) + (auVar7._0_8_ - 4503599627370496.0)) /
            ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    dVar5 = log(dVar8 / ((double)Vi.super___shared_ptr<Ensemble,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi * dVar1 * dVar5));
    local_38 = local_38 + dVar5 * dVar8;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)this_01);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&Vi);
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>::~gnarray
            ((gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>
              *)local_160);
  return local_38;
}

Assistant:

valtype WHAM<PENSEMBLE,HISTOGRAM,NARRAY>::whamvsrawi(const uint& i, const NARRAY& rho) const {
  const HISTOGRAM hist = (*hists)[i];
  const valtype sum = hist.sum();
  const valtype Qinv = expf[i]; //this is the inverse of the partition function 
  const pEnsemble Vi = (*V)[i];
  typename HISTOGRAM::const_iterator it;
  valtype eta = 0; //eta in equation 41 from reference DOI: 10.1002/jcc.21989
  for(it = hist.begin(); it != hist.end(); ++it) {
    //this is the raw normalized HISTOGRAM from i'th simulation
    const valtype praw = it->second/sum;
    //next we calculate the consensus HISTOGRAM from the WHAM distribution
    const coordtype coord = it->first;
    const vector<valtype> vals = hist.coord2val(coord);
    const valtype pwham = Qinv * exp(-Vi->ener(vals)) * rho[coord];
    //then we calculate eta, the relative entropy between praw and pwham
    eta += praw * log(praw/pwham);
  }
  return eta;
}